

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

void __thiscall
miniros::MasterLink::setParamImpl<bool>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map)

{
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var1;
  RpcValue xml_value;
  XmlRpcValue local_38;
  
  local_38._type = TypeInvalid;
  local_38._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertStruct(&local_38);
  for (p_Var1 = *(_Rb_tree_node_base **)(map + 0x18); p_Var1 != (_Rb_tree_node_base *)(map + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    XmlRpc::XmlRpcValue::assertStruct(&local_38);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                            *)local_38._value.asTime,(key_type *)(p_Var1 + 1));
    XmlRpc::XmlRpcValue::operator=(this_00,(bool *)(p_Var1 + 2));
  }
  set(this,key,&local_38);
  XmlRpc::XmlRpcValue::invalidate(&local_38);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::map<std::string, T>& map)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertStruct turns it
  // into a struct type
  RpcValue xml_value;
  xml_value.begin();

  // Copy the contents into the XmlRpcValue
  for (typename std::map<std::string, T>::const_iterator it = map.begin(); it != map.end(); ++it) {
    xml_value[it->first] = it->second;
  }

  this->set(key, xml_value);
}